

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment.c
# Opt level: O1

mi_slice_t * mi_segment_page_clear(mi_page_t *page,mi_segments_tld_t *tld)

{
  uint8_t uVar1;
  _Bool _Var2;
  mi_segment_t *pmVar3;
  uint8_t *addr;
  mi_slice_t *pmVar4;
  mi_segment_t *segment;
  mi_slice_t *slice;
  size_t psize;
  size_t local_30;
  
  pmVar3 = (mi_segment_t *)((ulong)((long)page[-1].padding + 7U) & 0xfffffffffe000000);
  segment = (mi_segment_t *)0x0;
  if (0 < (long)pmVar3) {
    segment = pmVar3;
  }
  _mi_stat_decrease(&tld->stats->page_committed,(ulong)page->capacity * page->block_size);
  _mi_stat_decrease(&tld->stats->pages,1);
  if (segment->allow_decommit == true) {
    _Var2 = mi_option_is_enabled(mi_option_deprecated_page_reset);
    if (_Var2) {
      addr = _mi_segment_page_start_from_slice(segment,page,page->block_size,&local_30);
      _mi_os_reset(addr,local_30);
    }
  }
  page->field_0x8 = page->field_0x8 & 0xfd;
  uVar1 = page->heap_tag;
  *(undefined8 *)((long)&page->next + 2) = 0;
  *(undefined8 *)((long)&page->prev + 2) = 0;
  *(undefined8 *)((long)&page->xthread_free + 2) = 0;
  *(undefined8 *)((long)&page->xheap + 2) = 0;
  *(undefined8 *)((long)&page->block_size + 2) = 0;
  *(undefined8 *)((long)&page->page_start + 2) = 0;
  *(undefined8 *)((long)&page->local_free + 2) = 0;
  *(undefined8 *)&page->block_size_shift = 0;
  *(undefined8 *)&page->capacity = 0;
  *(undefined8 *)((long)&page->free + 2) = 0;
  page->padding[0] = (void *)0x0;
  page->block_size = 1;
  page->heap_tag = uVar1;
  pmVar4 = mi_segment_span_free_coalesce(page,tld);
  segment->used = segment->used - 1;
  return pmVar4;
}

Assistant:

static mi_slice_t* mi_segment_page_clear(mi_page_t* page, mi_segments_tld_t* tld) {
  mi_assert_internal(page->block_size > 0);
  mi_assert_internal(mi_page_all_free(page));
  mi_segment_t* segment = _mi_ptr_segment(page);
  mi_assert_internal(segment->used > 0);

  size_t inuse = page->capacity * mi_page_block_size(page);
  _mi_stat_decrease(&tld->stats->page_committed, inuse);
  _mi_stat_decrease(&tld->stats->pages, 1);

  // reset the page memory to reduce memory pressure?
  if (segment->allow_decommit && mi_option_is_enabled(mi_option_deprecated_page_reset)) {
    size_t psize;
    uint8_t* start = _mi_segment_page_start(segment, page, &psize);
    _mi_os_reset(start, psize);
  }

  // zero the page data, but not the segment fields and heap tag
  page->is_zero_init = false;
  uint8_t heap_tag = page->heap_tag;
  ptrdiff_t ofs = offsetof(mi_page_t, capacity);
  _mi_memzero((uint8_t*)page + ofs, sizeof(*page) - ofs);
  page->block_size = 1;
  page->heap_tag = heap_tag;

  // and free it
  mi_slice_t* slice = mi_segment_span_free_coalesce(mi_page_to_slice(page), tld);
  segment->used--;
  // cannot assert segment valid as it is called during reclaim
  // mi_assert_expensive(mi_segment_is_valid(segment, tld));
  return slice;
}